

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.hpp
# Opt level: O3

index_t * __thiscall type_safe::index_t::operator-=(index_t *this,difference_t *rhs)

{
  integer_type_conflict1 iVar1;
  long lVar2;
  char *message;
  source_location local_10;
  
  iVar1 = (this->
          super_strong_typedef<type_safe::index_t,_type_safe::integer<unsigned_long,_type_safe::undefined_behavior_arithmetic>_>
          ).value_.value_;
  if ((long)iVar1 < 0) {
    local_10.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/integer.hpp"
    ;
    local_10.line_number = 0x167;
    message = "conversion would overflow";
  }
  else {
    lVar2 = (rhs->
            super_strong_typedef<type_safe::difference_t,_type_safe::integer<long,_type_safe::undefined_behavior_arithmetic>_>
            ).value_.value_;
    if (lVar2 + 0x7fffffffffffffff < (long)iVar1 && lVar2 < 1) {
      local_10.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/arithmetic_policy.hpp"
      ;
      local_10.line_number = 0x9a;
      message = "subtraction will result in underflow";
    }
    else {
      if (-1 < (long)(iVar1 - lVar2)) {
        (this->
        super_strong_typedef<type_safe::index_t,_type_safe::integer<unsigned_long,_type_safe::undefined_behavior_arithmetic>_>
        ).value_.value_ = iVar1 - lVar2;
        return this;
      }
      local_10.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/integer.hpp"
      ;
      local_10.line_number = 0x186;
      message = "conversion would underflow";
    }
  }
  debug_assert::default_handler::handle(&local_10,"",message);
  abort();
}

Assistant:

index_t& operator-=(const difference_t& rhs) noexcept
    {
        get(*this) = make_unsigned(make_signed(get(*this)) - get(rhs));
        return *this;
    }